

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::UncommittedAtomicOperations
          (UncommittedRegionsAccessTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  bool bVar1;
  bool local_2d;
  bool result;
  GLint level_local;
  GLuint *texture_local;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  UncommittedRegionsAccessTestCase *this_local;
  
  local_2d = true;
  bVar1 = atomicAllowed(this,target,format);
  if (bVar1) {
    std::operator<<((ostream *)
                    &(this->super_SparseTexture2CommitmentTestCase).
                     super_SparseTextureCommitmentTestCase.field_0x88,"Atomic Operations - ");
    local_2d = verifyAtomicOperations(this,gl,target,format,texture,level);
  }
  return local_2d;
}

Assistant:

bool UncommittedRegionsAccessTestCase::UncommittedAtomicOperations(const Functions& gl, GLint target, GLint format,
																   GLuint& texture, GLint level)
{
	bool result = true;

	if (atomicAllowed(target, format))
	{
		mLog << "Atomic Operations - ";
		result = result && verifyAtomicOperations(gl, target, format, texture, level);
	}

	return result;
}